

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall helics::LogManager::initializeLogging(LogManager *this,string *identifier)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  logger *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  bool bVar8;
  bool local_fd;
  uint local_fc;
  string local_f8;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  int local_bc;
  _Any_data local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  LOCK();
  bVar8 = (this->initialized)._M_base._M_i == false;
  if (bVar8) {
    (this->initialized)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar8) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->logIdentifier,identifier);
    local_b8._M_unused._M_object = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"console","");
    spdlog::get(&local_f8);
    sVar4 = local_f8._M_string_length;
    _Var3._M_p = local_f8._M_dataplus._M_p;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    p_Var1 = (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_p;
    (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_unused._0_8_ != &local_a8) {
      operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8._M_allocated_capacity + 1));
    }
    if ((this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      local_b8._M_unused._M_object = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"console","");
      spdlog::stdout_color_mt<spdlog::synchronous_factory>
                ((spdlog *)&local_f8,(string *)&local_b8,automatic);
      sVar4 = local_f8._M_string_length;
      _Var3._M_p = local_f8._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      p_Var1 = (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_p;
      (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_unused._0_8_ != &local_a8) {
        operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8._M_allocated_capacity + 1));
      }
      spdlog::logger::flush_on
                ((this->consoleLogger).
                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,info);
      spdlog::logger::set_level
                ((this->consoleLogger).
                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,trace);
    }
    iVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&this->logFile,"syslog");
    if (iVar7 == 0) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"syslog","");
      local_fc = 0;
      local_bc = 8;
      local_fd = false;
      local_b8._M_unused._M_object = &local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_f8._M_dataplus._M_p,
                 local_f8._M_dataplus._M_p + (long)(_func_int ***)local_f8._M_string_length);
      spdlog::synchronous_factory::
      create<spdlog::sinks::syslog_sink<std::mutex>,std::__cxx11::string_const&,int&,int&,bool&>
                ((synchronous_factory *)&local_d8,(string *)&local_b8,identifier,(int *)&local_fc,
                 &local_bc,&local_fd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_unused._0_8_ != &local_a8) {
        operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8._M_allocated_capacity + 1));
      }
      p_Var6 = p_Stack_d0;
      peVar5 = local_d8;
      local_d8 = (element_type *)0x0;
      p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar5;
      (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var6;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    else if ((this->logFile)._M_string_length != 0) {
      local_48 = (code *)0x0;
      uStack_40 = 0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_68 = (code *)0x0;
      uStack_60 = 0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_a8._M_allocated_capacity = 0;
      local_a8._8_8_ = 0;
      local_b8._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_b8._8_8_ = 0;
      local_fc = local_fc & 0xffffff00;
      pcVar2 = (identifier->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar2,pcVar2 + identifier->_M_string_length);
      spdlog::synchronous_factory::
      create<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&,spdlog::file_event_handlers_const&>
                ((synchronous_factory *)&local_d8,(string *)&local_f8,&this->logFile,
                 (bool *)&local_fc,(file_event_handlers *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = p_Stack_d0;
      peVar5 = local_d8;
      local_d8 = (element_type *)0x0;
      p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar5;
      (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var6;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
      }
    }
    this_00 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00 != (logger *)0x0) {
      spdlog::logger::flush_on(this_00,info);
      spdlog::logger::set_level
                ((this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,trace);
    }
  }
  return;
}

Assistant:

void LogManager::initializeLogging(const std::string& identifier)
{
    bool expected{false};
    if (initialized.compare_exchange_strong(expected, true)) {
        logIdentifier = identifier;
        try {
            consoleLogger = spdlog::get("console");
            if (!consoleLogger) {
                try {
                    consoleLogger = spdlog::stdout_color_mt("console");
                    consoleLogger->flush_on(spdlog::level::info);
                    consoleLogger->set_level(spdlog::level::trace);
                }
                catch (const spdlog::spdlog_ex&) {
                    consoleLogger = spdlog::get("console");
                }
            }
            if (logFile == "syslog") {
#if !defined(WIN32) && !defined(__MINGW32__) && !defined(CYGWIN) && !defined(_WIN32)
                fileLogger = spdlog::syslog_logger_mt("syslog", identifier);
#endif
            } else if (!logFile.empty()) {
                fileLogger = spdlog::basic_logger_mt(identifier, logFile);
            }
            if (fileLogger) {
                fileLogger->flush_on(spdlog::level::info);
                fileLogger->set_level(spdlog::level::trace);
            }
        }
        catch (const spdlog::spdlog_ex& ex) {
            std::cerr << "Log init failed in " << identifier << " : " << ex.what() << std::endl;
        }
    }
}